

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward16.c
# Opt level: O3

void intobuckets(group_conflict g,bucket_conflict *b,int *used1,int *used2,int pos)

{
  byte bVar1;
  bool bVar2;
  group_conflict pgVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  list_conflict tail;
  uint uVar7;
  list_conflict head;
  long lVar8;
  list plVar9;
  list_conflict tail_00;
  uint uVar10;
  group g_00;
  
  lVar5 = 0;
  do {
    used1[lVar5] = 0;
    *(undefined4 *)((long)b + lVar5 * 4) = 0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  resetmem(bucketmem);
  g_00 = g->nextunf;
  if (g_00 != (group)0x0) {
    lVar5 = (long)(int)used2;
    do {
      if (g_00->finis == 0) {
        head = g_00->head;
        bVar1 = head->str[lVar5];
        if (bVar1 == 0) {
          uVar7 = 0;
        }
        else {
          uVar7 = (uint)head->str[lVar5 + 1];
        }
        uVar7 = (uint)bVar1 << 8 | uVar7;
        plVar9 = head->next;
        pgVar3 = g_00;
        if (plVar9 == (list)0x0) {
LAB_00252be4:
          if ((char)uVar7 == '\0') goto LAB_00252b09;
        }
        else {
          bVar2 = true;
          do {
            iVar4 = 1;
            tail = head;
            while( true ) {
              tail_00 = plVar9;
              bVar1 = tail_00->str[lVar5];
              if (bVar1 == 0) {
                uVar10 = 0;
              }
              else {
                uVar10 = (uint)tail_00->str[lVar5 + 1];
              }
              uVar10 = (uint)bVar1 << 8 | uVar10;
              if (uVar10 != uVar7) break;
              iVar4 = iVar4 + 1;
              tail = tail_00;
              plVar9 = tail_00->next;
              if (tail_00->next == (list)0x0) {
                uVar10 = uVar7;
                if (!bVar2) goto LAB_00252bf4;
                goto LAB_00252be4;
              }
            }
            intobucket((bucket_conflict *)(forward2_b + (ulong)uVar7 * 8),head,tail,iVar4,g_00);
            g_00->head = tail_00;
            iVar4 = 1;
            used1[uVar7 & 0xff] = 1;
            *(undefined4 *)((long)b + (ulong)(uVar7 >> 8) * 4) = 1;
            plVar9 = tail_00->next;
            bVar2 = false;
            head = tail_00;
            uVar7 = uVar10;
          } while (plVar9 != (list)0x0);
LAB_00252bf4:
          intobucket((bucket_conflict *)(forward2_b + (ulong)uVar10 * 8),head,tail_00,iVar4,g_00);
          g_00->head = (list_conflict)0x0;
          used1[uVar10 & 0xff] = 1;
          *(undefined4 *)((long)b + (ulong)(uVar10 >> 8) * 4) = 1;
        }
      }
      else {
LAB_00252b09:
        g->nextunf = g_00->nextunf;
        pgVar3 = g;
      }
      g_00 = g_00->nextunf;
      g = pgVar3;
    } while (g_00 != (group)0x0);
  }
  lVar5 = 0;
  iVar4 = 0;
  iVar6 = 0;
  do {
    if (*(int *)((long)b + lVar5 * 4) != 0) {
      lVar8 = (long)iVar6;
      iVar6 = iVar6 + 1;
      *(int *)((long)b + lVar8 * 4) = (int)lVar5;
    }
    if (used1[lVar5] != 0) {
      lVar8 = (long)iVar4;
      iVar4 = iVar4 + 1;
      used1[lVar8] = (int)lVar5;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  *(int *)(b + 0x80) = iVar6;
  used1[0x100] = iVar4;
  return;
}

Assistant:

static void intobuckets(group g, bucket b[], 
                        int *used1, int *used2, int pos)
{
   group prevg;
   character ch, prevch;
   boolean split;
   list tail, tailn;
   int size;
   character buckets1, buckets2;

   for (ch = 0; ch < CHARS; ch++)
      used1[ch] = used2[ch] = FALSE;
   resetmem(bucketmem);
   for (prevg = g, g = g->nextunf ; g; g = g->nextunf) {
      if (g->finis)
         {prevg->nextunf = g->nextunf; continue;}
      tail = g->head; split = FALSE;
      prevch = SHORT(tail->str, pos); size = 1;
      for ( ; (tailn = tail->next); tail = tailn) {
         ch = SHORT(tailn->str, pos); size++;
         if (ch == prevch) continue;
         intobucket(b+prevch, g->head, tail, size-1, g);
         g->head = tailn; split = TRUE;
         used1[HIGH(prevch)] = used2[LOW(prevch)] = TRUE;
         prevch = ch; size = 1;
      }
      if (split) {
         intobucket(b+prevch, g->head, tail, size, g);
         g->head = NULL;
         used1[HIGH(prevch)] = used2[LOW(prevch)] = TRUE;
         prevg = g;
      } else if (IS_ENDMARK(prevch))
         prevg->nextunf = g->nextunf;
      else
         prevg = g;
   }
   buckets1 = buckets2 = 0;
   for (ch = 0; ch < CHARS; ch++) {
      if (used1[ch]) used1[buckets1++] = ch;
      if (used2[ch]) used2[buckets2++] = ch;
   }
   used1[CHARS] = buckets1; used2[CHARS] = buckets2;
/* printf("#buckets: %i\n", bucketp-bucketbase); */
}